

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

void StopREST(void)

{
  long lVar1;
  long in_FS_OFFSET;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,*(char **)((long)&uri_prefixes[0].prefix + lVar1),&local_49);
    UnregisterHTTPHandler(&local_48,false);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StopREST()
{
    for (const auto& up : uri_prefixes) {
        UnregisterHTTPHandler(up.prefix, false);
    }
}